

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O2

ostream * operator<<(ostream *out,Matrix *matrix)

{
  int iVar1;
  long lVar2;
  ostream *poVar3;
  int j;
  int iVar4;
  int i;
  int iVar5;
  
  lVar2 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 0x10) = 8;
  *(undefined8 *)(out + *(long *)(lVar2 + -0x18) + 8) = 4;
  for (iVar5 = 0; iVar5 < matrix->rows; iVar5 = iVar5 + 1) {
    for (iVar4 = 0; iVar1 = matrix->cols, iVar4 < iVar1; iVar4 = iVar4 + 1) {
      *(undefined8 *)(out + *(long *)(*(long *)out + -0x18) + 0x10) = 8;
      poVar3 = std::ostream::_M_insert<double>(matrix->data[iVar1 * iVar5 + iVar4]);
      std::operator<<(poVar3,' ');
    }
    std::endl<char,std::char_traits<char>>(out);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Matrix& matrix)
{
    out << std::setw(8) << std::setprecision(4);
    for (int i = 0; i < matrix.rows; i++)
    {
        for (int j = 0; j < matrix.cols; j++)
        {
            out << std::setw(8) << matrix(i, j) << ' ';
        }
        out << std::endl;
    }

    return out;
}